

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_392279::MLKEMTest_Encap1024TestVectors_Test::TestBody
          (MLKEMTest_Encap1024TestVectors_Test *this)

{
  function<void_(FileTest_*)> local_30;
  MLKEMTest_Encap1024TestVectors_Test *local_10;
  MLKEMTest_Encap1024TestVectors_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::function<void(&)(FileTest*),void>
            ((function<void(FileTest*)> *)&local_30,
             MLKEMEncapFileTest<MLKEM1024_public_key,_1568UL,_&MLKEM1024_parse_public_key,_1568UL,_&(anonymous_namespace)::wrapper_1024_encap_external_entropy>
            );
  FileTestGTest("crypto/mlkem/mlkem1024_encap_tests.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(MLKEMTest, Encap1024TestVectors) {
  FileTestGTest(
      "crypto/mlkem/mlkem1024_encap_tests.txt",
      MLKEMEncapFileTest<MLKEM1024_public_key, MLKEM1024_PUBLIC_KEY_BYTES,
                         MLKEM1024_parse_public_key, MLKEM1024_CIPHERTEXT_BYTES,
                         wrapper_1024_encap_external_entropy>);
}